

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::MergeFrom(MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            *this,MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                  *other)

{
  Node *pNVar1;
  undefined1 *this_00;
  const_iterator it;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
  local_68;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>,_bool>
  local_48;
  
  local_48.first.m_ = (InnerMap *)other;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
  ::InnerMap::
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
  ::SearchFrom((iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
                *)&local_48,(other->map_).elements_.index_of_first_non_null_);
  local_68.bucket_index_ = local_48.first.bucket_index_;
  local_68.node_ = local_48.first.node_;
  local_68.m_ = local_48.first.m_;
  if (local_48.first.node_ != (Node *)0x0) {
    do {
      pNVar1 = local_68.node_;
      Map<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>::InnerMap::
      insert<std::__cxx11::string_const&>
                (&local_48,this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68.node_
                );
      if (pNVar1 != local_48.first.node_) {
        this_00 = &(local_48.first.node_)->field_0x20;
        CoreML::Specification::MILSpec::Argument::Clear((Argument *)this_00);
        CoreML::Specification::MILSpec::Argument::MergeFrom
                  ((Argument *)this_00,(Argument *)&pNVar1->field_0x20);
      }
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
      ::operator++(&local_68);
    } while (local_68.node_ != (Node *)0x0);
  }
  return;
}

Assistant:

void MergeFrom(const MapFieldLite& other) {
    for (typename Map<Key, T>::const_iterator it = other.map_.begin();
         it != other.map_.end(); ++it) {
      map_[it->first] = it->second;
    }
  }